

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyserequation.cpp
# Opt level: O0

vector<std::shared_ptr<libcellml::AnalyserEquation>,_std::allocator<std::shared_ptr<libcellml::AnalyserEquation>_>_>
* __thiscall
libcellml::AnalyserEquation::dependencies
          (vector<std::shared_ptr<libcellml::AnalyserEquation>,_std::allocator<std::shared_ptr<libcellml::AnalyserEquation>_>_>
           *__return_storage_ptr__,AnalyserEquation *this)

{
  bool bVar1;
  vector<std::weak_ptr<libcellml::AnalyserEquation>,_std::allocator<std::weak_ptr<libcellml::AnalyserEquation>_>_>
  *this_00;
  value_type local_50;
  reference local_40;
  weak_ptr<libcellml::AnalyserEquation> *dependency;
  iterator __end1;
  iterator __begin1;
  vector<std::weak_ptr<libcellml::AnalyserEquation>,_std::allocator<std::weak_ptr<libcellml::AnalyserEquation>_>_>
  *__range1;
  AnalyserEquation *this_local;
  vector<std::shared_ptr<libcellml::AnalyserEquation>,_std::allocator<std::shared_ptr<libcellml::AnalyserEquation>_>_>
  *res;
  
  std::
  vector<std::shared_ptr<libcellml::AnalyserEquation>,_std::allocator<std::shared_ptr<libcellml::AnalyserEquation>_>_>
  ::vector(__return_storage_ptr__);
  this_00 = &this->mPimpl->mDependencies;
  __end1 = std::
           vector<std::weak_ptr<libcellml::AnalyserEquation>,_std::allocator<std::weak_ptr<libcellml::AnalyserEquation>_>_>
           ::begin(this_00);
  dependency = (weak_ptr<libcellml::AnalyserEquation> *)
               std::
               vector<std::weak_ptr<libcellml::AnalyserEquation>,_std::allocator<std::weak_ptr<libcellml::AnalyserEquation>_>_>
               ::end(this_00);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<std::weak_ptr<libcellml::AnalyserEquation>_*,_std::vector<std::weak_ptr<libcellml::AnalyserEquation>,_std::allocator<std::weak_ptr<libcellml::AnalyserEquation>_>_>_>
                                     *)&dependency), bVar1) {
    local_40 = __gnu_cxx::
               __normal_iterator<std::weak_ptr<libcellml::AnalyserEquation>_*,_std::vector<std::weak_ptr<libcellml::AnalyserEquation>,_std::allocator<std::weak_ptr<libcellml::AnalyserEquation>_>_>_>
               ::operator*(&__end1);
    std::weak_ptr<libcellml::AnalyserEquation>::lock
              ((weak_ptr<libcellml::AnalyserEquation> *)&local_50);
    std::
    vector<std::shared_ptr<libcellml::AnalyserEquation>,_std::allocator<std::shared_ptr<libcellml::AnalyserEquation>_>_>
    ::push_back(__return_storage_ptr__,&local_50);
    std::shared_ptr<libcellml::AnalyserEquation>::~shared_ptr(&local_50);
    __gnu_cxx::
    __normal_iterator<std::weak_ptr<libcellml::AnalyserEquation>_*,_std::vector<std::weak_ptr<libcellml::AnalyserEquation>,_std::allocator<std::weak_ptr<libcellml::AnalyserEquation>_>_>_>
    ::operator++(&__end1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<AnalyserEquationPtr> AnalyserEquation::dependencies() const
{
    std::vector<AnalyserEquationPtr> res;

    for (const auto &dependency : mPimpl->mDependencies) {
        res.push_back(dependency.lock());
    }

    return res;
}